

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char *txt)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  ulong *puVar4;
  ulong *local_78;
  ulong local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,'\x01');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x14c7ec);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_68 = *puVar4;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar4;
    local_78 = (ulong *)*plVar2;
  }
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_78 == &local_68) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_68;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_60;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_68;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_68 = local_68 & 0xffffffffffffff00;
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char           const & txt ) { return "\'" + std::string( 1, txt ) + "\'" ; }